

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O3

void __thiscall CTcParser::parse_enum(CTcParser *this,int *err)

{
  CVmHashEntry **ppCVar1;
  char *str;
  size_t len;
  _func_int **pp_Var2;
  bool bVar3;
  int iVar4;
  tc_toktyp_t tVar5;
  CTcSymbol *pCVar6;
  CVmHashEntry *this_00;
  textchar_t *sym;
  byte bVar7;
  
  CTcTokenizer::next(G_tok);
  bVar3 = true;
  if (((G_tok->curtok_).typ_ == TOKT_SYM) &&
     (iVar4 = CTcTokenizer::cur_tok_matches(G_tok,"token",5), iVar4 != 0)) {
    CTcTokenizer::next(G_tok);
    bVar7 = 1;
    bVar3 = false;
  }
  else {
    bVar7 = 0;
  }
  do {
    tVar5 = (G_tok->curtok_).typ_;
    if ((int)tVar5 < 0x17) {
      if (tVar5 != TOKT_SYM) {
        if (tVar5 != TOKT_EOF) goto LAB_001db019;
        goto LAB_001db0e4;
      }
      sym = (G_tok->curtok_).text_;
      pCVar6 = CTcPrsSymtab::find(this->global_symtab_,sym,(G_tok->curtok_).text_len_,
                                  (CTcPrsSymtab **)0x0);
      if (pCVar6 == (CTcSymbol *)0x0) {
        this_00 = (CVmHashEntry *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x38,(size_t)sym);
        str = (G_tok->curtok_).text_;
        len = (G_tok->curtok_).text_len_;
        pp_Var2 = (_func_int **)this->next_enum_id_;
        this->next_enum_id_ = (long)pp_Var2 + 1;
        CVmHashEntry::CVmHashEntry(this_00,str,len,0);
        *(undefined4 *)&this_00->field_0x24 = 10;
        this_00[1]._vptr_CVmHashEntry = pp_Var2;
        *(byte *)&this_00[1].nxt_ = *(byte *)&this_00[1].nxt_ & 0xfc | bVar7;
        this_00->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_00318b78;
        (*this->global_symtab_->_vptr_CTcPrsSymtab[3])(this->global_symtab_,this_00);
        (*this_00->_vptr_CVmHashEntry[0xf])(this_00);
      }
      else if (*(int *)&(pCVar6->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.
                        field_0x24 == 10) {
        if (!bVar3) {
          ppCVar1 = &pCVar6[1].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.nxt_;
          *(byte *)ppCVar1 = *(byte *)ppCVar1 | 1;
        }
      }
      else {
        CTcTokenizer::log_error_curtok(G_tok,0x2b8a);
      }
      tVar5 = CTcTokenizer::next(G_tok);
      if (0x16 < (int)tVar5) {
        if (1 < tVar5 - TOKT_LBRACE) {
          if (tVar5 == TOKT_SEM) goto LAB_001db106;
LAB_001db0c7:
          iVar4 = 0x2b8b;
          goto LAB_001db0cf;
        }
        goto LAB_001db0e4;
      }
      if (tVar5 != TOKT_COMMA) {
        if (tVar5 != TOKT_EOF) goto LAB_001db0c7;
        goto LAB_001db0e4;
      }
    }
    else {
      if (tVar5 - TOKT_LBRACE < 2) {
LAB_001db0e4:
        CTcTokenizer::log_error_curtok(G_tok,0x2b07);
        return;
      }
      if (tVar5 == TOKT_SEM) {
        CTcTokenizer::log_error_curtok(G_tok,0x2b89);
LAB_001db106:
        CTcTokenizer::next(G_tok);
        return;
      }
LAB_001db019:
      iVar4 = 0x2b89;
LAB_001db0cf:
      CTcTokenizer::log_error_curtok(G_tok,iVar4);
    }
    CTcTokenizer::next(G_tok);
  } while( true );
}

Assistant:

void CTcParser::parse_enum(int *err)
{
    int done;
    int is_token;

    /* presume it's not a 'token' enum */
    is_token = FALSE;
    
    /* skip the 'enum' token */
    G_tok->next();

    /* 
     *   if this is the 'token' context-sensitive keyword, note it and
     *   skip it 
     */
    if (G_tok->cur() == TOKT_SYM && G_tok->cur_tok_matches("token", 5))
    {
        /* remember that it's a 'token' enum */
        is_token = TRUE;

        /* skip the keyword */
        G_tok->next();
    }

    /* parse enum constants */
    for (done = FALSE ; !done ; )
    {
        CTcSymEnum *sym;
        
        switch (G_tok->cur())
        {
        case TOKT_SYM:
            /* make sure the symbol isn't already defined */
            sym = (CTcSymEnum *)
                  global_symtab_->find(G_tok->getcur()->get_text(),
                                       G_tok->getcur()->get_text_len());

            /* if it's already defined, make sure it's an enum */
            if (sym != 0)
            {
                /* if it's not an enum, it's an error */
                if (sym->get_type() != TC_SYM_ENUM)
                {
                    /* log the error */
                    G_tok->log_error_curtok(TCERR_REDEF_AS_ENUM);
                }
                else if (is_token)
                {
                    /* 
                     *   we're defining a token - mark the old symbol as a
                     *   token if it wasn't already 
                     */
                    sym->set_is_token(TRUE);
                }
            }
            else
            {
                /* create the new symbol */
                sym = new CTcSymEnum(G_tok->getcur()->get_text(),
                                     G_tok->getcur()->get_text_len(),
                                     FALSE, new_enum_id(), is_token);

                /* add it to the symbol table */
                global_symtab_->add_entry(sym);

                /* mark it as referenced, since it's defined here */
                sym->mark_referenced();
            }

            /* skip the symbol name and see what follows */
            switch(G_tok->next())
            {
            case TOKT_COMMA:
                /* skip the comma and keep going */
                G_tok->next();
                break;
                
            case TOKT_SEM:
                /* end of the statement */
                done = TRUE;
                G_tok->next();
                break;

            case TOKT_LBRACE:
            case TOKT_RBRACE:
            case TOKT_EOF:
                /* they probably omitted the closing semicolon */
                G_tok->log_error_curtok(TCERR_EXPECTED_SEMI);
                done = TRUE;
                break;

            default:
                /* a comma was required */
                G_tok->log_error_curtok(TCERR_ENUM_REQ_COMMA);

                /* skip the offending symbol and proceed */
                G_tok->next();
                break;
            }

            /* done with this token */
            break;

        case TOKT_LBRACE:
        case TOKT_RBRACE:
        case TOKT_EOF:
            /* 
             *   they probably omitted the closing semicolon - log an
             *   error, then stop scanning the statement, since we're
             *   probably in the next statement already 
             */
            G_tok->log_error_curtok(TCERR_EXPECTED_SEMI);
            done = TRUE;
            break;

        case TOKT_SEM:
            /* they must have left out a symbol */
            G_tok->log_error_curtok(TCERR_ENUM_REQ_SYM);

            /* accept the semicolon as the end of the statement */
            G_tok->next();
            done = TRUE;
            break;
            
        default:
            /* anything else is an error */
            G_tok->log_error_curtok(TCERR_ENUM_REQ_SYM);

            /* skip the offending token and keep parsing */
            G_tok->next();
            break;
        }
    }
}